

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O0

AggregateFunction *
duckdb::GetTypedApproxQuantileListAggregateFunction<signed_char,signed_char>(LogicalType *type)

{
  AggregateFunction *in_RDI;
  AggregateFunction *fun;
  LogicalType *in_stack_000000f0;
  LogicalType *in_stack_000000f8;
  AggregateFunction *pAVar1;
  
  pAVar1 = in_RDI;
  ApproxQuantileListAggregate<duckdb::ApproxQuantileState,signed_char,duckdb::list_entry_t,duckdb::ApproxQuantileListOperation<signed_char>>
            (in_stack_000000f8,in_stack_000000f0);
  pAVar1->serialize = ApproximateQuantileBindData::Serialize;
  pAVar1->deserialize = ApproximateQuantileBindData::Deserialize;
  return in_RDI;
}

Assistant:

AggregateFunction GetTypedApproxQuantileListAggregateFunction(const LogicalType &type) {
	using STATE = ApproxQuantileState;
	using OP = ApproxQuantileListOperation<INPUT_TYPE>;
	auto fun = ApproxQuantileListAggregate<STATE, INPUT_TYPE, list_entry_t, OP>(type, type);
	fun.serialize = ApproximateQuantileBindData::Serialize;
	fun.deserialize = ApproximateQuantileBindData::Deserialize;
	return fun;
}